

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O1

bool spvtools::val::anon_unknown_2::ContainsInvalidBool
               (ValidationState_t *_,Instruction *storage,bool skip_builtin)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  undefined8 in_RAX;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  Instruction *pIVar6;
  undefined7 in_register_00000011;
  ulong index;
  bool bVar7;
  bool bVar8;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if ((int)CONCAT71(in_register_00000011,skip_builtin) != 0) {
    uStack_38 = CONCAT44((storage->inst_).result_id,(int)in_RAX);
    pmVar4 = std::
             map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
             ::operator[](&_->id_decorations_,(key_type *)((long)&uStack_38 + 4));
    for (p_Var5 = (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar8 = (_Rb_tree_header *)p_Var5 != &(pmVar4->_M_t)._M_impl.super__Rb_tree_header, bVar8;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      if (p_Var5[1]._M_color == 0xb) {
        if (bVar8) {
          return false;
        }
        break;
      }
    }
  }
  uVar1 = (storage->inst_).opcode;
  if (uVar1 < 0x1f) {
    if ((0x31800000U >> (uVar1 & 0x1f) & 1) != 0) {
      uVar3 = Instruction::GetOperandAs<unsigned_int>(storage,1);
      pIVar6 = ValidationState_t::FindDef(_,uVar3);
      bVar8 = ContainsInvalidBool(_,pIVar6,skip_builtin);
      return bVar8;
    }
    if (uVar1 == 0x14) {
      return true;
    }
    if (uVar1 == 0x1e) {
      bVar7 = (ulong)((long)(storage->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(storage->operands_).
                           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                           ._M_impl.super__Vector_impl_data._M_start) < 0x11;
      bVar8 = !bVar7;
      if (bVar7) {
        bVar7 = false;
      }
      else {
        uVar3 = Instruction::GetOperandAs<unsigned_int>(storage,1);
        pIVar6 = ValidationState_t::FindDef(_,uVar3);
        bVar7 = ContainsInvalidBool(_,pIVar6,skip_builtin);
        if (!bVar7) {
          index = 2;
          do {
            bVar8 = index < (ulong)((long)(storage->operands_).
                                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(storage->operands_).
                                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4);
            if (!bVar8) break;
            uVar3 = Instruction::GetOperandAs<unsigned_int>(storage,index);
            pIVar6 = ValidationState_t::FindDef(_,uVar3);
            bVar2 = ContainsInvalidBool(_,pIVar6,skip_builtin);
            bVar7 = (bool)(bVar7 | bVar2);
            index = index + 1;
          } while (!bVar2);
        }
      }
      if (bVar8) {
        return bVar7;
      }
    }
  }
  return false;
}

Assistant:

bool ContainsInvalidBool(ValidationState_t& _, const Instruction* storage,
                         bool skip_builtin) {
  if (skip_builtin) {
    for (const Decoration& decoration : _.id_decorations(storage->id())) {
      if (decoration.dec_type() == spv::Decoration::BuiltIn) return false;
    }
  }

  const size_t elem_type_index = 1;
  uint32_t elem_type_id;
  Instruction* elem_type;

  switch (storage->opcode()) {
    case spv::Op::OpTypeBool:
      return true;
    case spv::Op::OpTypeVector:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray:
      elem_type_id = storage->GetOperandAs<uint32_t>(elem_type_index);
      elem_type = _.FindDef(elem_type_id);
      return ContainsInvalidBool(_, elem_type, skip_builtin);
    case spv::Op::OpTypeStruct:
      for (size_t member_type_index = 1;
           member_type_index < storage->operands().size();
           ++member_type_index) {
        auto member_type_id =
            storage->GetOperandAs<uint32_t>(member_type_index);
        auto member_type = _.FindDef(member_type_id);
        if (ContainsInvalidBool(_, member_type, skip_builtin)) return true;
      }
    default:
      break;
  }
  return false;
}